

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::setEncryptionParameters
          (QPDFWriter *this,char *user_password,char *owner_password,int V,int R,int key_len,
          set<int,_std::less<int>,_std::allocator<int>_> *bits_to_clear)

{
  string *id1;
  bool encrypt_metadata;
  element_type *peVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  uint uVar4;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar5;
  allocator<char> local_129;
  char *local_128;
  int local_120;
  int local_11c;
  string O;
  string U;
  string encryption_key;
  string Perms;
  string UE;
  string OE;
  string local_50;
  
  O._M_dataplus._M_p._0_4_ = 1;
  local_128 = owner_password;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&bits_to_clear->_M_t,(int *)&O);
  O._M_dataplus._M_p._0_4_ = 2;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&bits_to_clear->_M_t,(int *)&O);
  if (3 < R) {
    O._M_dataplus._M_p._0_4_ = 10;
    pVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range(&bits_to_clear->_M_t,(key_type *)&O);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&bits_to_clear->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
  }
  p_Var2 = (bits_to_clear->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(bits_to_clear->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = 0;
    do {
      uVar4 = uVar4 | 1 << ((byte)((char)p_Var2[1]._M_color - _S_black) & 0x1f);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    uVar4 = ~uVar4;
  }
  generateID(this);
  O._M_dataplus._M_p = (pointer)&O.field_2;
  O._M_string_length = 0;
  O.field_2._M_local_buf[0] = '\0';
  U._M_dataplus._M_p = (pointer)&U.field_2;
  U._M_string_length = 0;
  U.field_2._M_local_buf[0] = '\0';
  OE._M_dataplus._M_p = (pointer)&OE.field_2;
  OE._M_string_length = 0;
  OE.field_2._M_local_buf[0] = '\0';
  UE._M_dataplus._M_p = (pointer)&UE.field_2;
  UE._M_string_length = 0;
  UE.field_2._M_local_buf[0] = '\0';
  Perms._M_dataplus._M_p = (pointer)&Perms.field_2;
  Perms._M_string_length = 0;
  Perms.field_2._M_local_buf[0] = '\0';
  encryption_key._M_dataplus._M_p = (pointer)&encryption_key.field_2;
  encryption_key._M_string_length = 0;
  encryption_key.field_2._M_local_buf[0] = '\0';
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  id1 = &peVar1->id1;
  encrypt_metadata = peVar1->encrypt_metadata;
  if (V < 5) {
    QPDF::compute_encryption_O_U
              (user_password,local_128,V,R,key_len,uVar4,encrypt_metadata,id1,&O,&U);
  }
  else {
    QPDF::compute_encryption_parameters_V5
              (user_password,local_128,V,R,key_len,uVar4,encrypt_metadata,id1,&encryption_key,&O,&U,
               &OE,&UE,&Perms);
  }
  local_128 = (char *)CONCAT44(local_128._4_4_,key_len);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_120 = V;
  local_11c = R;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,user_password,&local_129);
  setEncryptionParametersInternal
            (this,local_120,local_11c,(int)local_128,uVar4,&O,&U,&OE,&UE,&Perms,&peVar1->id1,
             &local_50,&encryption_key);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_key._M_dataplus._M_p != &encryption_key.field_2) {
    operator_delete(encryption_key._M_dataplus._M_p,
                    CONCAT71(encryption_key.field_2._M_allocated_capacity._1_7_,
                             encryption_key.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)Perms._M_dataplus._M_p != &Perms.field_2) {
    operator_delete(Perms._M_dataplus._M_p,
                    CONCAT71(Perms.field_2._M_allocated_capacity._1_7_,Perms.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)UE._M_dataplus._M_p != &UE.field_2) {
    operator_delete(UE._M_dataplus._M_p,
                    CONCAT71(UE.field_2._M_allocated_capacity._1_7_,UE.field_2._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)OE._M_dataplus._M_p != &OE.field_2) {
    operator_delete(OE._M_dataplus._M_p,
                    CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)U._M_dataplus._M_p != &U.field_2) {
    operator_delete(U._M_dataplus._M_p,
                    CONCAT71(U.field_2._M_allocated_capacity._1_7_,U.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)O._M_dataplus._M_p != &O.field_2) {
    operator_delete(O._M_dataplus._M_p,
                    CONCAT71(O.field_2._M_allocated_capacity._1_7_,O.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::setEncryptionParameters(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    std::set<int>& bits_to_clear)
{
    // PDF specification refers to bits with the low bit numbered 1.
    // We have to convert this into a bit field.

    // Specification always requires bits 1 and 2 to be cleared.
    bits_to_clear.insert(1);
    bits_to_clear.insert(2);

    if (R > 3) {
        // Bit 10 is deprecated and should always be set.  This used to mean accessibility.  There
        // is no way to disable accessibility with R > 3.
        bits_to_clear.erase(10);
    }

    int P = 0;
    // Create the complement of P, then invert.
    for (int b: bits_to_clear) {
        P |= (1 << (b - 1));
    }
    P = ~P;

    generateID();
    std::string O;
    std::string U;
    std::string OE;
    std::string UE;
    std::string Perms;
    std::string encryption_key;
    if (V < 5) {
        QPDF::compute_encryption_O_U(
            user_password, owner_password, V, R, key_len, P, m->encrypt_metadata, m->id1, O, U);
    } else {
        QPDF::compute_encryption_parameters_V5(
            user_password,
            owner_password,
            V,
            R,
            key_len,
            P,
            m->encrypt_metadata,
            m->id1,
            encryption_key,
            O,
            U,
            OE,
            UE,
            Perms);
    }
    setEncryptionParametersInternal(
        V, R, key_len, P, O, U, OE, UE, Perms, m->id1, user_password, encryption_key);
}